

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O2

BOOL objc_registerSmallObjectClass_np(Class class,uintptr_t mask)

{
  if ((mask < 8) && (SmallObjectClasses[mask] == (Class)0x0)) {
    SmallObjectClasses[mask] = class;
    return '\x01';
  }
  return '\0';
}

Assistant:

BOOL objc_registerSmallObjectClass_np(Class class, uintptr_t mask)
{
	if ((mask & OBJC_SMALL_OBJECT_MASK) != mask)
	{
		return NO;
	}
	if (sizeof(void*) == 4)
	{
		if (Nil == SmallObjectClasses[0])
		{
			SmallObjectClasses[0] = class;
			return YES;
		}
		return NO;
	}
	if (Nil != SmallObjectClasses[mask])
	{
		return NO;
	}
	SmallObjectClasses[mask] = class;
	return YES;
}